

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,Handle lt,C cRt)

{
  int iVar1;
  long lVar2;
  _Base_bitset<1UL> unaff_R12;
  ulong uVar3;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar4;
  Relations relsLt;
  Relations relsBound;
  _Base_bitset<1UL> local_58;
  _Base_bitset<1UL> local_50;
  uint local_48 [6];
  
  if (cRt != (C)0x0) {
    local_48[0] = 2;
    local_48[1] = 4;
    local_48[2] = 6;
    local_48[3] = 8;
    lVar2 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)local_48 + lVar2);
      local_58._M_w = 0;
      if (0xb < uVar3) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar3,0xc);
      }
      pVar4 = getBound(this,lt,(Relations)(1L << ((byte)*(uint *)((long)local_48 + lVar2) & 0x3f)));
      local_58._M_w = (_WordT)pVar4.second.bits.super__Base_bitset<1UL>._M_w;
      if (pVar4.first == (C)0x0) {
        iVar1 = 3;
      }
      else {
        local_50._M_w = (_WordT)compare(pVar4.first,cRt);
        if ((local_50._M_w >> (uVar3 & 0x3f) & 1) == 0) {
          iVar1 = 0;
        }
        else {
          unaff_R12._M_w = dg::vr::compose((Relations *)&local_58,(Relations *)&local_50);
          iVar1 = 1;
        }
      }
      if ((iVar1 != 3) && (iVar1 != 0)) {
        return (Relations)unaff_R12._M_w;
      }
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x10);
  }
  return (Relations)0;
}

Assistant:

Relations ValueRelations::_between(Handle lt, C cRt) const {
    if (!cRt)
        return {};

    for (Relations::Type rel :
         {Relations::SLE, Relations::ULE, Relations::SGE, Relations::UGE}) {
        C boundLt;
        Relations relsLt;
        std::tie(boundLt, relsLt) = getBound(lt, Relations().set(rel));

        if (!boundLt)
            continue;

        Relations relsBound = compare(boundLt, cRt);
        // lt <= boundLt <= cRt || lt >= boundLt >= cRt
        if (relsBound.has(rel))
            return compose(relsLt, relsBound);
    }
    return {};
}